

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O0

PassToken spvtools::CreateReplaceDescArrayAccessUsingVarIndexPass(void)

{
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  in_RDI;
  unique_ptr<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex,_std::default_delete<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex>_>
  local_20;
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  local_18 [2];
  
  MakeUnique<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex>();
  MakeUnique<spvtools::Optimizer::PassToken::Impl,std::unique_ptr<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex,std::default_delete<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex>>>
            ((spvtools *)local_18,&local_20);
  Optimizer::PassToken::PassToken
            ((PassToken *)
             in_RDI._M_t.
             super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
             .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl,
             local_18);
  std::
  unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
  ::~unique_ptr(local_18);
  std::
  unique_ptr<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex,_std::default_delete<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex>_>
  ::~unique_ptr(&local_20);
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::Optimizer::PassToken::Impl_*,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
             .super__Head_base<0UL,_spvtools::Optimizer::PassToken::Impl_*,_false>._M_head_impl;
}

Assistant:

Optimizer::PassToken CreateReplaceDescArrayAccessUsingVarIndexPass() {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::ReplaceDescArrayAccessUsingVarIndex>());
}